

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O0

int it_read_instrument(IT_INSTRUMENT *instrument,DUMBFILE *f,int maxlen)

{
  int iVar1;
  int iVar2;
  int32 iVar3;
  int in_EDX;
  IT_ENVELOPE *in_RSI;
  long in_RDI;
  int len;
  int n;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar4 = 0;
  if (in_EDX != 0) {
    iVar4 = dumbfile_pos((DUMBFILE *)in_RSI);
  }
  dumbfile_skip((DUMBFILE *)in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  dumbfile_getnc((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (int32)((ulong)in_RDI >> 0x20),(DUMBFILE *)in_RSI);
  *(undefined1 *)(in_RDI + 0x28) = 0;
  iVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 0x126) = (char)iVar1;
  iVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 0x127) = (char)iVar1;
  iVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 0x128) = (char)iVar1;
  iVar1 = dumbfile_igetw((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  *(int *)(in_RDI + 0x2c) = iVar1;
  iVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 0x129) = (char)iVar1;
  iVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 0x12a) = (char)iVar1;
  iVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 299) = (char)iVar1;
  iVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 300) = (char)iVar1;
  iVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 0x12d) = (char)iVar1;
  iVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 0x12e) = (char)iVar1;
  dumbfile_skip((DUMBFILE *)in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  dumbfile_getnc((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (int32)((ulong)in_RDI >> 0x20),(DUMBFILE *)in_RSI);
  *(undefined1 *)(in_RDI + 0x1a) = 0;
  iVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 0x12f) = (char)iVar1;
  iVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 0x130) = (char)iVar1;
  dumbfile_skip((DUMBFILE *)in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  for (iVar1 = 0; iVar1 < 0x78; iVar1 = iVar1 + 1) {
    iVar2 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
    *(char *)(in_RDI + 0x131 + (long)iVar1) = (char)iVar2;
    iVar2 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
    *(short *)(in_RDI + 0x1aa + (long)iVar1 * 2) = (short)iVar2;
  }
  iVar2 = dumbfile_error((DUMBFILE *)in_RSI);
  if (iVar2 == 0) {
    iVar2 = it_read_envelope(in_RSI,(DUMBFILE *)CONCAT44(in_EDX,iVar1));
    if (iVar2 == 0) {
      iVar2 = it_read_envelope(in_RSI,(DUMBFILE *)CONCAT44(in_EDX,iVar1));
      if (iVar2 == 0) {
        iVar1 = it_read_envelope(in_RSI,(DUMBFILE *)CONCAT44(in_EDX,iVar1));
        if (iVar1 == 0) {
          if (in_EDX != 0) {
            iVar3 = dumbfile_pos((DUMBFILE *)in_RSI);
            iVar4 = iVar3 - iVar4;
            if (in_EDX - iVar4 < 0x7c) {
              return 0;
            }
          }
          iVar3 = dumbfile_mgetl((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
          if (iVar3 == 0x5854504d) {
            for (iVar1 = 0; iVar1 < 0x78; iVar1 = iVar1 + 1) {
              iVar2 = dumbfile_getc((DUMBFILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
              *(short *)(in_RDI + 0x1aa + (long)iVar1 * 2) =
                   *(short *)(in_RDI + 0x1aa + (long)iVar1 * 2) + (short)(iVar2 << 8);
            }
            iVar4 = dumbfile_error((DUMBFILE *)in_RSI);
            if (iVar4 != 0) {
              return -1;
            }
          }
          iVar4 = 0;
        }
        else {
          iVar4 = -1;
        }
      }
      else {
        iVar4 = -1;
      }
    }
    else {
      iVar4 = -1;
    }
  }
  else {
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

static int it_read_instrument(IT_INSTRUMENT *instrument, DUMBFILE *f, int maxlen)
{
	int n, len = 0;

	/*if (dumbfile_mgetl(f) != IT_INSTRUMENT_SIGNATURE)
		return -1;*/
	// XXX

	if (maxlen) len = dumbfile_pos(f);

	dumbfile_skip(f, 4);

    dumbfile_getnc((char *)instrument->filename, 13, f);
	instrument->filename[13] = 0;

	instrument->new_note_action = dumbfile_getc(f);
	instrument->dup_check_type = dumbfile_getc(f);
	instrument->dup_check_action = dumbfile_getc(f);
	instrument->fadeout = dumbfile_igetw(f);
	instrument->pp_separation = dumbfile_getc(f);
	instrument->pp_centre = dumbfile_getc(f);
	instrument->global_volume = dumbfile_getc(f);
	instrument->default_pan = dumbfile_getc(f);
	instrument->random_volume = dumbfile_getc(f);
	instrument->random_pan = dumbfile_getc(f);

	/* Skip Tracker Version and Number of Samples. These are only used in
	 * separate instrument files. Also skip unused byte.
	 */
	dumbfile_skip(f, 4);

    dumbfile_getnc((char *)instrument->name, 26, f);
	instrument->name[26] = 0;

	instrument->filter_cutoff = dumbfile_getc(f);
	instrument->filter_resonance = dumbfile_getc(f);

	/* Skip MIDI Channel, Program and Bank. */
	//dumbfile_skip(f, 4);
	/*instrument->output = dumbfile_getc(f);
	if ( instrument->output > 16 ) {
		instrument->output -= 128;
	} else {
		instrument->output = 0;
	}
	dumbfile_skip(f, 3);*/
	dumbfile_skip(f, 4);

	for (n = 0; n < 120; n++) {
		instrument->map_note[n] = dumbfile_getc(f);
		instrument->map_sample[n] = dumbfile_getc(f);
	}

	if (dumbfile_error(f))
		return -1;

	if (it_read_envelope(&instrument->volume_envelope, f)) return -1;
	if (it_read_envelope(&instrument->pan_envelope, f)) return -1;
	if (it_read_envelope(&instrument->pitch_envelope, f)) return -1;

	if (maxlen) {
		len = dumbfile_pos(f) - len;
		if ( maxlen - len < 124 ) return 0;
	}

	if ( dumbfile_mgetl(f) == IT_MPTX_SIGNATURE ) {
		for ( n = 0; n < 120; n++ ) {
			instrument->map_sample[ n ] += dumbfile_getc( f ) << 8;
		}

		if (dumbfile_error(f))
			return -1;
	}

	/*if ( dumbfile_mgetl(f) == IT_INSM_SIGNATURE ) {
		int32 end = dumbfile_igetl(f);
		end += dumbfile_pos(f);
		while ( dumbfile_pos(f) < end ) {
			int chunkid = dumbfile_igetl(f);
			switch ( chunkid ) {
				case DUMB_ID('P','L','U','G'):
					instrument->output = dumbfile_getc(f);
					break;
				default:
					chunkid = chunkid / 0x100 + dumbfile_getc(f) * 0x1000000;
					break;
			}
		}

		if (dumbfile_error(f))
			return -1;
	}*/

	return 0;
}